

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenconv.h
# Opt level: O2

VectorXf makeEigenVectorFromVectors(vector<float,_std::allocator<float>_> *vecvalues)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Index extraout_RDX;
  Index IVar3;
  Index extraout_RDX_00;
  long *in_RSI;
  size_t i;
  ulong index;
  VectorXf VVar4;
  size_t n;
  ulong local_20;
  
  local_20 = in_RSI[1] - *in_RSI >> 2;
  Eigen::Matrix<float,_-1,_1,_0,_-1,_1>::Matrix<unsigned_long>
            ((Matrix<float,__1,_1,_0,__1,_1> *)vecvalues,&local_20);
  IVar3 = extraout_RDX;
  for (index = 0; index < local_20; index = index + 1) {
    SVar1 = *(Scalar *)(*in_RSI + index * 4);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)vecvalues,index
                       );
    *pSVar2 = SVar1;
    IVar3 = extraout_RDX_00;
  }
  VVar4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar3;
  VVar4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (float *)vecvalues;
  return (VectorXf)VVar4.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

inline VectorXf makeEigenVectorFromVectors(const vector<float> &vecvalues)
{
    size_t n = vecvalues.size();
    VectorXf b(n);

    for (size_t i = 0; i < n; ++i)
    {
        b(i) = vecvalues[i];
    }

    return b;

}